

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O2

MessageType __thiscall
google::protobuf::json_internal::ClassifyMessage(json_internal *this,string_view name)

{
  bool bVar1;
  char *pcVar2;
  string_view prefix;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_10;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_11;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_12;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_13;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_14;
  string_view text;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  size_t sStack_20;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  text._M_str = (char *)name._M_len;
  local_18._M_str = text._M_str;
  local_18._M_len = (size_t)this;
  prefix._M_str = "google.protobuf.";
  prefix._M_len = 0x10;
  text._M_len = (size_t)this;
  bVar1 = absl::lts_20240722::StartsWith(text,prefix);
  if (!bVar1) {
    return kNotWellKnown;
  }
  local_18 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       (&local_18,0x10,0xffffffffffffffff);
  pcVar2 = local_18._M_str;
  switch(local_18._M_len) {
  case 3:
    __y._M_str = "Any";
    __y._M_len = 3;
    __x._M_str = pcVar2;
    __x._M_len = 3;
    bVar1 = std::operator==(__x,__y);
    if (bVar1) {
      return kAny;
    }
    break;
  case 5:
    __y_03._M_str = "Value";
    __y_03._M_len = 5;
    __x_01._M_str = pcVar2;
    __x_01._M_len = 5;
    bVar1 = std::operator==(__x_01,__y_03);
    if (bVar1) {
      return kValue;
    }
    break;
  case 6:
    __y_08._M_str = "Struct";
    __y_08._M_len = 6;
    __x_04._M_str = pcVar2;
    __x_04._M_len = 6;
    bVar1 = std::operator==(__x_04,__y_08);
    if (bVar1) {
      return kStruct;
    }
    break;
  case 8:
    __y_09._M_str = "Duration";
    __y_09._M_len = 8;
    __x_05._M_str = pcVar2;
    __x_05._M_len = 8;
    bVar1 = std::operator==(__x_05,__y_09);
    if (bVar1) {
      return kDuration;
    }
    break;
  case 9:
    __y_10._M_str = "BoolValue";
    __y_10._M_len = 9;
    __x_06._M_str = pcVar2;
    __x_06._M_len = 9;
    bVar1 = std::operator==(__x_06,__y_10);
    if (bVar1) {
      return kWrapper;
    }
    __y_11._M_str = "NullValue";
    __y_11._M_len = 9;
    bVar1 = std::operator==(local_18,__y_11);
    if (bVar1) {
      return kNull;
    }
    __y_12._M_str = "ListValue";
    __y_12._M_len = 9;
    bVar1 = std::operator==(local_18,__y_12);
    if (bVar1) {
      return kList;
    }
    __y_13._M_str = "Timestamp";
    __y_13._M_len = 9;
    bVar1 = std::operator==(local_18,__y_13);
    if (bVar1) {
      return kTimestamp;
    }
    __y_14._M_str = "FieldMask";
    __y_14._M_len = 9;
    bVar1 = std::operator==(local_18,__y_14);
    if (bVar1) {
      return kFieldMask;
    }
    break;
  case 10:
    __y_00._M_str = "BytesValue";
    __y_00._M_len = 10;
    __x_00._M_str = pcVar2;
    __x_00._M_len = 10;
    bVar1 = std::operator==(__x_00,__y_00);
    if (bVar1) {
      return kWrapper;
    }
    __y_01._M_str = "FloatValue";
    __y_01._M_len = 10;
    bVar1 = std::operator==(local_18,__y_01);
    if (bVar1) {
      return kWrapper;
    }
    __y_02._M_str = "Int32Value";
    __y_02._M_len = 10;
    bVar1 = std::operator==(local_18,__y_02);
    if (bVar1) {
      return kWrapper;
    }
    pcVar2 = "google.protobuf.Int64Value";
    sStack_20 = 10;
    goto LAB_002972bd;
  case 0xb:
    __y_04._M_str = "DoubleValue";
    __y_04._M_len = 0xb;
    __x_02._M_str = pcVar2;
    __x_02._M_len = 0xb;
    bVar1 = std::operator==(__x_02,__y_04);
    if (bVar1) {
      return kWrapper;
    }
    __y_05._M_str = "StringValue";
    __y_05._M_len = 0xb;
    bVar1 = std::operator==(local_18,__y_05);
    if (bVar1) {
      return kWrapper;
    }
    __y_06._M_str = "UInt32Value";
    __y_06._M_len = 0xb;
    bVar1 = std::operator==(local_18,__y_06);
    if (bVar1) {
      return kWrapper;
    }
    pcVar2 = "google.protobuf.UInt64Value";
    sStack_20 = 0xb;
LAB_002972bd:
    __y_07._M_str = pcVar2 + 0x10;
    __y_07._M_len = sStack_20;
    __x_03._M_str = local_18._M_str;
    __x_03._M_len = local_18._M_len;
    bVar1 = std::operator==(__x_03,__y_07);
    if (bVar1) {
      return kWrapper;
    }
  }
  return kNotWellKnown;
}

Assistant:

inline MessageType ClassifyMessage(absl::string_view name) {
  constexpr absl::string_view kWellKnownPkg = "google.protobuf.";
  if (!absl::StartsWith(name, kWellKnownPkg)) {
    return MessageType::kNotWellKnown;
  }
  name = name.substr(kWellKnownPkg.size());

  switch (name.size()) {
    case 3:
      if (name == "Any") {
        return MessageType::kAny;
      }
      break;
    case 5:
      if (name == "Value") {
        return MessageType::kValue;
      }
      break;
    case 6:
      if (name == "Struct") {
        return MessageType::kStruct;
      }
      break;
    case 8:
      if (name == "Duration") {
        return MessageType::kDuration;
      }
      break;
    case 9:
      if (name == "BoolValue") {
        return MessageType::kWrapper;
      }
      if (name == "NullValue") {
        return MessageType::kNull;
      }
      if (name == "ListValue") {
        return MessageType::kList;
      }
      if (name == "Timestamp") {
        return MessageType::kTimestamp;
      }
      if (name == "FieldMask") {
        return MessageType::kFieldMask;
      }
      break;
    case 10:
      if (name == "BytesValue" || name == "FloatValue" ||
          name == "Int32Value" || name == "Int64Value") {
        return MessageType::kWrapper;
      }
      break;
    case 11:
      if (name == "DoubleValue" || name == "StringValue" ||
          name == "UInt32Value" || name == "UInt64Value") {
        return MessageType::kWrapper;
      }
      break;
    default:
      break;
  }

  return MessageType::kNotWellKnown;
}